

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

auto_ptr<cmCryptoHash> __thiscall cmCryptoHash::New(cmCryptoHash *this,char *algo)

{
  int iVar1;
  cmCryptoHashMD5 *this_00;
  cmCryptoHashSHA1 *this_01;
  cmCryptoHashSHA224 *this_02;
  cmCryptoHashSHA256 *this_03;
  cmCryptoHashSHA384 *this_04;
  cmCryptoHashSHA512 *this_05;
  auto_ptr<cmCryptoHash> local_98;
  cmCryptoHash *local_90;
  auto_ptr<cmCryptoHash> local_88;
  cmCryptoHash *local_80;
  auto_ptr<cmCryptoHash> local_78;
  cmCryptoHash *local_70;
  auto_ptr<cmCryptoHash> local_68;
  cmCryptoHash *local_60;
  auto_ptr<cmCryptoHash> local_58;
  cmCryptoHash *local_50;
  auto_ptr<cmCryptoHash> local_48;
  cmCryptoHash *local_40;
  auto_ptr<cmCryptoHash> local_28;
  cmCryptoHash *local_20;
  char *local_18;
  char *algo_local;
  
  local_18 = algo;
  algo_local = (char *)this;
  iVar1 = strcmp(algo,"MD5");
  if (iVar1 == 0) {
    this_00 = (cmCryptoHashMD5 *)operator_new(0x10);
    cmCryptoHashMD5::cmCryptoHashMD5(this_00);
    cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_28,(cmCryptoHash *)this_00);
    local_20 = (cmCryptoHash *)cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_28)
    ;
    cmsys::auto_ptr<cmCryptoHash>::auto_ptr
              ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_20);
    cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_28);
  }
  else {
    iVar1 = strcmp(local_18,"SHA1");
    if (iVar1 == 0) {
      this_01 = (cmCryptoHashSHA1 *)operator_new(0x10);
      cmCryptoHashSHA1::cmCryptoHashSHA1(this_01);
      cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_48,(cmCryptoHash *)this_01);
      local_40 = (cmCryptoHash *)
                 cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_48);
      cmsys::auto_ptr<cmCryptoHash>::auto_ptr
                ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_40);
      cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_48);
    }
    else {
      iVar1 = strcmp(local_18,"SHA224");
      if (iVar1 == 0) {
        this_02 = (cmCryptoHashSHA224 *)operator_new(0x10);
        cmCryptoHashSHA224::cmCryptoHashSHA224(this_02);
        cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_58,(cmCryptoHash *)this_02);
        local_50 = (cmCryptoHash *)
                   cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_58);
        cmsys::auto_ptr<cmCryptoHash>::auto_ptr
                  ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_50);
        cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_58);
      }
      else {
        iVar1 = strcmp(local_18,"SHA256");
        if (iVar1 == 0) {
          this_03 = (cmCryptoHashSHA256 *)operator_new(0x10);
          cmCryptoHashSHA256::cmCryptoHashSHA256(this_03);
          cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_68,(cmCryptoHash *)this_03);
          local_60 = (cmCryptoHash *)
                     cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_68);
          cmsys::auto_ptr<cmCryptoHash>::auto_ptr
                    ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_60);
          cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_68);
        }
        else {
          iVar1 = strcmp(local_18,"SHA384");
          if (iVar1 == 0) {
            this_04 = (cmCryptoHashSHA384 *)operator_new(0x10);
            cmCryptoHashSHA384::cmCryptoHashSHA384(this_04);
            cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_78,(cmCryptoHash *)this_04);
            local_70 = (cmCryptoHash *)
                       cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_78);
            cmsys::auto_ptr<cmCryptoHash>::auto_ptr
                      ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_70);
            cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_78);
          }
          else {
            iVar1 = strcmp(local_18,"SHA512");
            if (iVar1 == 0) {
              this_05 = (cmCryptoHashSHA512 *)operator_new(0x10);
              cmCryptoHashSHA512::cmCryptoHashSHA512(this_05);
              cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_88,(cmCryptoHash *)this_05);
              local_80 = (cmCryptoHash *)
                         cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_88);
              cmsys::auto_ptr<cmCryptoHash>::auto_ptr
                        ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_80);
              cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_88);
            }
            else {
              cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_98,(cmCryptoHash *)0x0);
              local_90 = (cmCryptoHash *)
                         cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_98);
              cmsys::auto_ptr<cmCryptoHash>::auto_ptr
                        ((auto_ptr<cmCryptoHash> *)this,(auto_ptr_ref<cmCryptoHash>)local_90);
              cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_98);
            }
          }
        }
      }
    }
  }
  return (auto_ptr<cmCryptoHash>)this;
}

Assistant:

cmsys::auto_ptr<cmCryptoHash> cmCryptoHash::New(const char* algo)
{
  if(strcmp(algo,"MD5") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashMD5); }
  else if(strcmp(algo,"SHA1") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA1); }
  else if(strcmp(algo,"SHA224") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA224); }
  else if(strcmp(algo,"SHA256") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA256); }
  else if(strcmp(algo,"SHA384") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA384); }
  else if(strcmp(algo,"SHA512") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA512); }
  else
    { return cmsys::auto_ptr<cmCryptoHash>(0); }
}